

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

TestCase *
iutest::detail::
TypeParamTestInstance<iu_StringViewSplit_x_iutest_x_chain_at_last_by_single_char_Test,_iutest::detail::VariadicTypeList<char,_wchar_t,_char16_t,_char32_t>_>
::EachTest<iutest::detail::VariadicTypeList<char16_t,_char32_t>,_void>::AddTestCase
          (char *testcase,size_t index)

{
  UnitTest *this;
  char *testcase_name;
  TypeId id;
  TestCase *pTVar1;
  size_t in_RCX;
  string local_38;
  char *local_18;
  size_t index_local;
  char *testcase_local;
  
  local_18 = (char *)index;
  index_local = (size_t)testcase;
  this = UnitTest::instance();
  MakeIndexTestName_abi_cxx11_(&local_38,(detail *)index_local,local_18,in_RCX);
  testcase_name = (char *)std::__cxx11::string::c_str();
  id = internal::GetTypeId<iutest::detail::None>();
  pTVar1 = UnitTestImpl::AddTestCase<iutest::TypedTestCase<char16_t>>
                     (&this->super_UnitTestImpl,testcase_name,id,Test::SetUpTestCase,
                      Test::TearDownTestCase);
  std::__cxx11::string::~string((string *)&local_38);
  return pTVar1;
}

Assistant:

static TestCase* AddTestCase(const char* testcase, size_t index)
        {
#if !defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
            return UnitTest::instance().AddTestCase<_MyTestCase>(
#else
            return UnitTest::instance().AddTestCase(
#endif
#if IUTEST_HAS_TYPED_TEST_APPEND_TYPENAME
                detail::MakeIndexTypedTestName<TypeParam>(testcase, index).c_str()
#else
                detail::MakeIndexTestName(testcase, index).c_str()
#endif
                , internal::GetTypeId<detail::None>()   // TypeId を統一するためダミー引数を渡す
                , TestBody::SetUpTestCase
                , TestBody::TearDownTestCase
#if defined(IUTEST_NO_EXPLICIT_FUNCTION_TEMPLATE_ARGUMENTS)
                , detail::explicit_type<_MyTestCase>()
#endif
                );
        }